

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.h
# Opt level: O2

void __thiscall
cbtQuantizedBvh::mergeInternalNodeAabb
          (cbtQuantizedBvh *this,int nodeIndex,cbtVector3 *newAabbMin,cbtVector3 *newAabbMax)

{
  cbtQuantizedBvhNode *pcVar1;
  int i;
  long lVar2;
  unsigned_short quantizedAabbMax [3];
  unsigned_short quantizedAabbMin [3];
  
  if (this->m_useQuantization == true) {
    quantize(this,quantizedAabbMin,newAabbMin,0);
    quantize(this,quantizedAabbMax,newAabbMax,1);
    pcVar1 = (this->m_quantizedContiguousNodes).m_data;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if (quantizedAabbMin[lVar2] < pcVar1[nodeIndex].m_quantizedAabbMin[lVar2]) {
        pcVar1[nodeIndex].m_quantizedAabbMin[lVar2] = quantizedAabbMin[lVar2];
      }
      if (pcVar1[nodeIndex].m_quantizedAabbMax[lVar2] < quantizedAabbMax[lVar2]) {
        pcVar1[nodeIndex].m_quantizedAabbMax[lVar2] = quantizedAabbMax[lVar2];
      }
    }
    return;
  }
  cbtVector3::setMin(&(this->m_contiguousNodes).m_data[nodeIndex].m_aabbMinOrg,newAabbMin);
  cbtVector3::setMax(&(this->m_contiguousNodes).m_data[nodeIndex].m_aabbMaxOrg,newAabbMax);
  return;
}

Assistant:

void mergeInternalNodeAabb(int nodeIndex, const cbtVector3& newAabbMin, const cbtVector3& newAabbMax)
	{
		if (m_useQuantization)
		{
			unsigned short int quantizedAabbMin[3];
			unsigned short int quantizedAabbMax[3];
			quantize(quantizedAabbMin, newAabbMin, 0);
			quantize(quantizedAabbMax, newAabbMax, 1);
			for (int i = 0; i < 3; i++)
			{
				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] > quantizedAabbMin[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[i] = quantizedAabbMin[i];

				if (m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] < quantizedAabbMax[i])
					m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[i] = quantizedAabbMax[i];
			}
		}
		else
		{
			//non-quantized
			m_contiguousNodes[nodeIndex].m_aabbMinOrg.setMin(newAabbMin);
			m_contiguousNodes[nodeIndex].m_aabbMaxOrg.setMax(newAabbMax);
		}
	}